

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O1

float Gia_ObjPropagateRequired(Gia_Man_t *p,int iObj,int fUseSorting)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_128 [32];
  float local_a8 [34];
  
  if (-1 < iObj) {
    iVar2 = p->vMapping->nSize;
    if (iObj < iVar2) {
      piVar4 = p->vMapping->pArray;
      uVar11 = piVar4[(uint)iObj];
      uVar12 = (ulong)uVar11;
      if (uVar12 == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                      ,0xb1,"float Gia_ObjPropagateRequired(Gia_Man_t *, int, int)");
      }
      pvVar5 = p->pLutLib;
      if (pvVar5 == (void *)0x0) {
        uVar9 = iObj * 3 + 1;
        iVar3 = p->vTiming->nSize;
        if (iVar3 <= (int)uVar9) goto LAB_0071b6ac;
        if ((int)uVar11 < iVar2 && -1 < (int)uVar11) {
          pfVar6 = p->vTiming->pArray;
          fVar14 = pfVar6[uVar9] + -1.0;
          uVar7 = 0;
          uVar10 = (ulong)(uint)piVar4[uVar12];
          if (piVar4[uVar12] < 1) {
            uVar10 = uVar7;
          }
          do {
            if (uVar10 == uVar7) {
              return fVar14;
            }
            if ((piVar4[uVar12 + uVar7 + 1] < 0) ||
               (uVar9 = piVar4[uVar12 + uVar7 + 1] * 3 + 1, iVar3 <= (int)uVar9)) goto LAB_0071b6ac;
            if (fVar14 < pfVar6[uVar9]) {
              pfVar6[uVar9] = fVar14;
            }
            uVar7 = uVar7 + 1;
          } while ((int)uVar11 < iVar2 && -1 < (int)uVar11);
        }
      }
      else if (*(int *)((long)pvVar5 + 0xc) == 0) {
        if ((int)uVar11 < iVar2 && -1 < (int)uVar11) {
          uVar11 = iObj * 3 + 1;
          iVar2 = p->vTiming->nSize;
          if ((int)uVar11 < iVar2) {
            iVar3 = piVar4[uVar12];
            pfVar6 = p->vTiming->pArray;
            fVar14 = pfVar6[uVar11] - *(float *)((long)pvVar5 + (long)iVar3 * 0x84 + 0x94);
            if (iVar3 < 1) {
              return fVar14;
            }
            lVar8 = 0;
            while ((-1 < piVar4[uVar12 + lVar8 + 1] &&
                   (uVar11 = piVar4[uVar12 + lVar8 + 1] * 3 + 1, (int)uVar11 < iVar2))) {
              if (fVar14 < pfVar6[uVar11]) {
                pfVar6[uVar11] = fVar14;
              }
              lVar8 = lVar8 + 1;
              if (iVar3 == lVar8) {
                return fVar14;
              }
            }
          }
          goto LAB_0071b6ac;
        }
      }
      else if ((int)uVar11 < iVar2 && -1 < (int)uVar11) {
        uVar11 = piVar4[uVar12];
        lVar8 = (long)(int)uVar11 * 0x84 + 0x94;
        if (fUseSorting == 0) {
          if ((int)uVar11 < 1) {
            return 0.0;
          }
          uVar9 = iObj * 3 + 1;
          iVar2 = p->vTiming->nSize;
          if ((int)uVar9 < iVar2) {
            pfVar6 = p->vTiming->pArray;
            uVar10 = 0;
            while ((-1 < piVar4[uVar12 + uVar10 + 1] &&
                   (uVar13 = piVar4[uVar12 + uVar10 + 1] * 3 + 1, (int)uVar13 < iVar2))) {
              fVar14 = pfVar6[uVar9] - *(float *)((long)pvVar5 + uVar10 * 4 + lVar8);
              if (fVar14 < pfVar6[uVar13]) {
                pfVar6[uVar13] = fVar14;
              }
              uVar10 = uVar10 + 1;
              if (uVar11 == uVar10) {
                return fVar14;
              }
            }
          }
LAB_0071b6ac:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        Gia_LutDelayTraceSortPins(p,iObj,local_128,local_a8);
        iVar2 = p->vMapping->nSize;
        if (iObj < iVar2) {
          piVar4 = p->vMapping->pArray;
          iVar3 = piVar4[(uint)iObj];
          if ((-1 < (long)iVar3) && (iVar3 < iVar2)) {
            puVar1 = (uint *)(piVar4 + iVar3);
            uVar11 = *puVar1;
            if ((int)uVar11 < 1) {
              return 0.0;
            }
            uVar9 = iObj * 3 + 1;
            iVar3 = p->vTiming->nSize;
            if ((int)uVar9 < iVar3) {
              pfVar6 = p->vTiming->pArray;
              uVar12 = 0;
              while ((uVar13 = puVar1[(long)local_128[uVar12] + 1], -1 < (int)uVar13 &&
                     (uVar13 = uVar13 * 3 + 1, (int)uVar13 < iVar3))) {
                fVar14 = pfVar6[uVar9] - *(float *)((long)pvVar5 + uVar12 * 4 + lVar8);
                if (fVar14 < pfVar6[uVar13]) {
                  pfVar6[uVar13] = fVar14;
                }
                if (iVar2 <= iObj) goto LAB_0071b588;
                uVar12 = uVar12 + 1;
                if (uVar11 == uVar12) {
                  return fVar14;
                }
              }
            }
            goto LAB_0071b6ac;
          }
        }
      }
    }
  }
LAB_0071b588:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

float Gia_ObjPropagateRequired( Gia_Man_t * p, int iObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int k, iFanin, pPinPerm[32];
    float pPinDelays[32];
    float tRequired = 0.0; // Suppress "might be used uninitialized"
    float * pDelays;
    assert( Gia_ObjIsLut(p, iObj) );
    if ( pLutLib == NULL )
    {
        tRequired = Gia_ObjTimeRequired( p, iObj) - (float)1.0;
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                Gia_ObjSetTimeRequired( p, iFanin, tRequired );
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        tRequired = Gia_ObjTimeRequired(p, iObj) - pDelays[0];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                Gia_ObjSetTimeRequired( p, iFanin, tRequired );
    }
    else 
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        if ( fUseSorting )
        {
            Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
            Gia_LutForEachFanin( p, iObj, iFanin, k )
            {
                tRequired = Gia_ObjTimeRequired( p, iObj) - pDelays[k];
                if ( Gia_ObjTimeRequired( p, Gia_ObjLutFanin(p, iObj,pPinPerm[k])) > tRequired )
                    Gia_ObjSetTimeRequired( p,  Gia_ObjLutFanin(p, iObj,pPinPerm[k]), tRequired );
            }
        }
        else
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
            {
                tRequired = Gia_ObjTimeRequired(p, iObj) - pDelays[k];
                if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                    Gia_ObjSetTimeRequired( p,  iFanin, tRequired );
            }
        }
    }
    return tRequired;
}